

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layout.c++
# Opt level: O1

MessageSizeCounts __thiscall capnp::_::ListReader::totalSize(ListReader *this)

{
  long lVar1;
  ElementSize EVar2;
  uint uVar3;
  ulong uVar4;
  StructPointerCount SVar6;
  WirePointer *ref;
  Iterator __begin4;
  uint uVar7;
  long lVar8;
  WordCount64 amount;
  MessageSizeCounts MVar9;
  ulong uVar5;
  
  EVar2 = this->elementSize;
  uVar5 = 0;
  uVar4 = 0;
  if (EVar2 - 1 < 5) {
    amount = (ulong)*(uint *)(BITS_PER_ELEMENT_TABLE + (ulong)EVar2 * 4) * (ulong)this->elementCount
             + 0x3f >> 6;
    uVar4 = uVar5;
  }
  else if (EVar2 == POINTER) {
    amount = (WordCount64)this->elementCount;
    if (amount != 0) {
      lVar1 = amount * 8;
      lVar8 = 0;
      uVar4 = 0;
      do {
        MVar9 = WireHelpers::totalSize
                          (this->segment,(WirePointer *)(this->ptr + lVar8),this->nestingLimit);
        amount = amount + MVar9.wordCount;
        uVar4 = (ulong)((int)uVar4 + MVar9.capCount);
        lVar8 = lVar8 + 8;
      } while (lVar1 - lVar8 != 0);
    }
  }
  else if (EVar2 == INLINE_COMPOSITE) {
    uVar3 = this->elementCount;
    amount = ((ulong)this->step * (ulong)uVar3 >> 6) + 1;
    uVar4 = uVar5;
    if (uVar3 != 0 && this->structPointerCount != 0) {
      ref = (WirePointer *)this->ptr;
      uVar4 = 0;
      uVar7 = 0;
      do {
        ref = ref + (this->structDataSize >> 6);
        for (SVar6 = this->structPointerCount; SVar6 != 0; SVar6 = SVar6 - 1) {
          MVar9 = WireHelpers::totalSize(this->segment,ref,this->nestingLimit);
          amount = amount + MVar9.wordCount;
          uVar4 = (ulong)((int)uVar4 + MVar9.capCount);
          ref = ref + 1;
        }
        uVar7 = uVar7 + 1;
      } while (uVar7 != uVar3);
    }
  }
  else {
    amount = 0;
    uVar4 = uVar5;
  }
  if (this->segment != (SegmentReader *)0x0) {
    ReadLimiter::unread(this->segment->readLimiter,amount);
  }
  MVar9._8_8_ = uVar4;
  MVar9.wordCount = amount;
  return MVar9;
}

Assistant:

MessageSizeCounts ListReader::totalSize() const {
  // TODO(cleanup): This is kind of a lot of logic duplicated from WireHelpers::totalSize(), but
  //   it's unclear how to share it effectively.

  MessageSizeCounts result = { ZERO * WORDS, 0 };

  switch (elementSize) {
    case ElementSize::VOID:
      // Nothing.
      break;
    case ElementSize::BIT:
    case ElementSize::BYTE:
    case ElementSize::TWO_BYTES:
    case ElementSize::FOUR_BYTES:
    case ElementSize::EIGHT_BYTES:
      result.addWords(WireHelpers::roundBitsUpToWords(
          upgradeBound<uint64_t>(elementCount) * dataBitsPerElement(elementSize)));
      break;
    case ElementSize::POINTER: {
      auto count = elementCount * (POINTERS / ELEMENTS);
      result.addWords(count * WORDS_PER_POINTER);

      for (auto i: kj::zeroTo(count)) {
        result += WireHelpers::totalSize(segment, reinterpret_cast<const WirePointer*>(ptr) + i,
                                         nestingLimit);
      }
      break;
    }
    case ElementSize::INLINE_COMPOSITE: {
      // Don't forget to count the tag word.
      auto wordSize = upgradeBound<uint64_t>(elementCount) * step / BITS_PER_WORD;
      result.addWords(wordSize + POINTER_SIZE_IN_WORDS);

      if (structPointerCount > ZERO * POINTERS) {
        const word* pos = reinterpret_cast<const word*>(ptr);
        for (auto i KJ_UNUSED: kj::zeroTo(elementCount)) {
          pos += structDataSize / BITS_PER_WORD;

          for (auto j KJ_UNUSED: kj::zeroTo(structPointerCount)) {
            result += WireHelpers::totalSize(segment, reinterpret_cast<const WirePointer*>(pos),
                                             nestingLimit);
            pos += POINTER_SIZE_IN_WORDS;
          }
        }
      }
      break;
    }
  }

  if (segment != nullptr) {
    // This traversal should not count against the read limit, because it's highly likely that
    // the caller is going to traverse the object again, e.g. to copy it.
    segment->unread(result.wordCount);
  }

  return result;
}